

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Bech32.cpp
# Opt level: O1

void __thiscall
Bech32Test_strip_unknown_chars_Test::~Bech32Test_strip_unknown_chars_Test
          (Bech32Test_strip_unknown_chars_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Bech32Test, strip_unknown_chars) {
    EXPECT_EQ(bech32::stripUnknownChars("tx1-rqqq-qqqq-qmhu-qk"), "tx1rqqqqqqqqmhuqk");
    // TODO Not sure what to do about the extra '1' in the next test. We leave it in
    // because we leave in the separator character, but I think the test might be expected
    // to take it out. Not sure if it is a buggy test example from the spec or what.
    //EXPECT_EQ(bech32::stripUnknownChars("TX1R1JK0--U5bNG4JSb----FMC"), "TX1RJK0U5NG4JSFMC");
    EXPECT_EQ(bech32::stripUnknownChars("TX1RJK0--U5bNG4JSb----FMC"), "TX1RJK0U5NG4JSFMC");
    EXPECT_EQ(bech32::stripUnknownChars("tx1 rjk0 u5ng 4jsfmc"), "tx1rjk0u5ng4jsfmc");
    EXPECT_EQ(bech32::stripUnknownChars("tx1!rjk0\\u5ng*4jsf^^mc"), "tx1rjk0u5ng4jsfmc");
}